

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O1

void duckdb::BitStringAggOperation::
     Operation<unsigned_long,duckdb::BitAggState<unsigned_long>,duckdb::BitStringAggOperation>
               (BitAggState<unsigned_long> *state,unsigned_long *input,
               AggregateUnaryInput *unary_input)

{
  AggregateInputData *this;
  FunctionData *pFVar1;
  ulong uVar2;
  ulong uVar3;
  idx_t iVar4;
  char (*__src) [4];
  BinderException *this_00;
  OutOfRangeException *pOVar5;
  InvalidInputException *this_01;
  string_t target;
  anon_union_16_2_67f50693_for_value local_130;
  char local_120 [16];
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this = unary_input->input;
  optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
  pFVar1 = (this->bind_data).ptr;
  if (state->is_set == false) {
    if ((pFVar1[0x20] != (FunctionData)0x0) || (pFVar1[0x60] == (FunctionData)0x1)) {
      this_00 = (BinderException *)__cxa_allocate_exception(0x10);
      local_130._0_8_ = local_120;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,
                 "Could not retrieve required statistics. Alternatively, try by providing the statistics explicitly: BITSTRING_AGG(col, min, max) "
                 ,"");
      duckdb::BinderException::BinderException(this_00,(string *)&local_130.pointer);
      __cxa_throw(this_00,&BinderException::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar2 = duckdb::Value::GetValue<unsigned_long>();
    state->min = uVar2;
    uVar2 = duckdb::Value::GetValue<unsigned_long>();
    state->max = uVar2;
    if (uVar2 < state->min) {
      this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_130._0_8_ = local_120;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,
                 "Invalid explicit bitstring range: Minimum (%s) > maximum (%s)","");
      NumericHelper::ToString<unsigned_long>(&local_50,state->min);
      NumericHelper::ToString<unsigned_long>(&local_70,state->max);
      InvalidInputException::InvalidInputException<std::__cxx11::string,std::__cxx11::string>
                (this_01,(string *)&local_130.pointer,&local_50,&local_70);
      __cxa_throw(this_01,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar2 = duckdb::Value::GetValue<unsigned_long>();
    uVar3 = duckdb::Value::GetValue<unsigned_long>();
    iVar4 = GetRange<unsigned_long>(uVar2,uVar3);
    if (1000000000 < iVar4) {
      pOVar5 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_130._0_8_ = local_120;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,
                 "The range between min and max value (%s <-> %s) is too large for bitstring aggregation"
                 ,"");
      NumericHelper::ToString<unsigned_long>(&local_90,state->min);
      NumericHelper::ToString<unsigned_long>(&local_b0,state->max);
      OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
                (pOVar5,(string *)&local_130.pointer,&local_90,&local_b0);
      __cxa_throw(pOVar5,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar2 = duckdb::Bit::ComputeBitstringLen(iVar4);
    local_130.pointer.length = (uint32_t)uVar2;
    if (0xc < uVar2) {
      __src = (char (*) [4])operator_new__(uVar2);
      if (local_130.pointer.length < 0xd) {
        local_130._12_4_ = 0;
        local_130.pointer.prefix[0] = '\0';
        local_130.pointer.prefix[1] = '\0';
        local_130.pointer.prefix[2] = '\0';
        local_130.pointer.prefix[3] = '\0';
        local_130._8_4_ = 0;
        if (local_130.pointer.length != 0) {
          memcpy(local_130.pointer.prefix,__src,(ulong)(local_130.pointer.length & 0xf));
        }
      }
      else {
        local_130.pointer.prefix = *__src;
        local_130._8_4_ = SUB84(__src,0);
        local_130._12_4_ = (undefined4)((ulong)__src >> 0x20);
      }
    }
    duckdb::Bit::SetEmptyBitString((string_t *)&local_130.pointer,iVar4);
    (state->value).value.pointer.length = local_130.pointer.length;
    *(char (*) [4])((long)&(state->value).value + 4) = local_130.pointer.prefix;
    *(undefined4 *)((long)&(state->value).value + 8) = local_130._8_4_;
    *(undefined4 *)((long)&(state->value).value + 0xc) = local_130._12_4_;
    state->is_set = true;
  }
  uVar2 = *input;
  if ((state->min <= uVar2) && (uVar2 <= state->max)) {
    uVar3 = duckdb::Value::GetValue<unsigned_long>();
    duckdb::Bit::SetBit(&state->value,uVar2 - uVar3,1);
    return;
  }
  pOVar5 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_130._0_8_ = local_120;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_130,"Value %s is outside of provided min and max range (%s <-> %s)",""
            );
  NumericHelper::ToString<unsigned_long>(&local_d0,*input);
  NumericHelper::ToString<unsigned_long>(&local_f0,state->min);
  NumericHelper::ToString<unsigned_long>(&local_110,state->max);
  OutOfRangeException::
  OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (pOVar5,(string *)&local_130.pointer,&local_d0,&local_f0,&local_110);
  __cxa_throw(pOVar5,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void Operation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input) {
		auto &bind_agg_data = unary_input.input.bind_data->template Cast<BitstringAggBindData>();
		if (!state.is_set) {
			if (bind_agg_data.min.IsNull() || bind_agg_data.max.IsNull()) {
				throw BinderException(
				    "Could not retrieve required statistics. Alternatively, try by providing the statistics "
				    "explicitly: BITSTRING_AGG(col, min, max) ");
			}
			state.min = bind_agg_data.min.GetValue<INPUT_TYPE>();
			state.max = bind_agg_data.max.GetValue<INPUT_TYPE>();
			if (state.min > state.max) {
				throw InvalidInputException("Invalid explicit bitstring range: Minimum (%s) > maximum (%s)",
				                            NumericHelper::ToString(state.min), NumericHelper::ToString(state.max));
			}
			idx_t bit_range =
			    GetRange(bind_agg_data.min.GetValue<INPUT_TYPE>(), bind_agg_data.max.GetValue<INPUT_TYPE>());
			if (bit_range > MAX_BIT_RANGE) {
				throw OutOfRangeException(
				    "The range between min and max value (%s <-> %s) is too large for bitstring aggregation",
				    NumericHelper::ToString(state.min), NumericHelper::ToString(state.max));
			}
			idx_t len = Bit::ComputeBitstringLen(bit_range);
			auto target = len > string_t::INLINE_LENGTH ? string_t(new char[len], UnsafeNumericCast<uint32_t>(len))
			                                            : string_t(UnsafeNumericCast<uint32_t>(len));
			Bit::SetEmptyBitString(target, bit_range);

			state.value = target;
			state.is_set = true;
		}
		if (input >= state.min && input <= state.max) {
			Execute(state, input, bind_agg_data.min.GetValue<INPUT_TYPE>());
		} else {
			throw OutOfRangeException("Value %s is outside of provided min and max range (%s <-> %s)",
			                          NumericHelper::ToString(input), NumericHelper::ToString(state.min),
			                          NumericHelper::ToString(state.max));
		}
	}